

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moveGeneration.cpp
# Opt level: O0

void setAllToZero(bitboards *game,U64 endMask)

{
  ulong uVar1;
  U64 mask;
  U64 endMask_local;
  bitboards *game_local;
  
  uVar1 = endMask ^ 0xffffffffffffffff;
  game->WP = uVar1 & game->WP;
  game->WN = uVar1 & game->WN;
  game->WB = uVar1 & game->WB;
  game->WR = uVar1 & game->WR;
  game->WQ = uVar1 & game->WQ;
  game->WK = uVar1 & game->WK;
  game->BP = uVar1 & game->BP;
  game->BN = uVar1 & game->BN;
  game->BB = uVar1 & game->BB;
  game->BR = uVar1 & game->BR;
  game->BQ = uVar1 & game->BQ;
  game->BK = uVar1 & game->BK;
  return;
}

Assistant:

void setAllToZero(bitboards* game, U64 endMask) {
  U64 mask = ~endMask;
  game->WP &= mask;
  game->WN &= mask;
  game->WB &= mask;
  game->WR &= mask;
  game->WQ &= mask;
  game->WK &= mask;
  game->BP &= mask;
  game->BN &= mask;
  game->BB &= mask;
  game->BR &= mask;
  game->BQ &= mask;
  game->BK &= mask;
}